

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

char * deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::getAttributeName
                 (VaryingSource test)

{
  char *pcStack_10;
  VaryingSource test_local;
  
  if (test == READ_ATTRIBUTE) {
    pcStack_10 = "a_emitCount";
  }
  else if (test == READ_UNIFORM) {
    pcStack_10 = "a_vertexNdx";
  }
  else if (test == READ_TEXTURE) {
    pcStack_10 = "a_vertexNdx";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

const char* VaryingOutputCountShader::getAttributeName (VaryingSource test)
{
	switch (test)
	{
		case READ_ATTRIBUTE:	return "a_emitCount";
		case READ_UNIFORM:		return "a_vertexNdx";
		case READ_TEXTURE:		return "a_vertexNdx";
		default:
			DE_ASSERT(DE_FALSE);
			return "";
	}
}